

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

void wasm::UniqueNameMapper::uniquify(wasm::Expression*)::Walker::doPreVisitControlFlow(Walker*,wasm
     ::Expression___(Walker *self,Expression **currp)

{
  Expression *this;
  Try *pTVar1;
  Walker *local_18;
  Walker *self_local;
  
  self_local = (Walker *)&stack0xffffffffffffffe8;
  this = *currp;
  local_18 = self;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pTVar1 = (Try *)Expression::cast<wasm::Block>(this);
    goto LAB_009de23c;
  case IfId:
    Expression::cast<wasm::If>(this);
    break;
  case LoopId:
    pTVar1 = (Try *)Expression::cast<wasm::Loop>(this);
    goto LAB_009de23c;
  case BreakId:
    Expression::cast<wasm::Break>(this);
    break;
  case SwitchId:
    Expression::cast<wasm::Switch>(this);
    break;
  case CallId:
    Expression::cast<wasm::Call>(this);
    break;
  case CallIndirectId:
    Expression::cast<wasm::CallIndirect>(this);
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(this);
    break;
  case LocalSetId:
    Expression::cast<wasm::LocalSet>(this);
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(this);
    break;
  case GlobalSetId:
    Expression::cast<wasm::GlobalSet>(this);
    break;
  case LoadId:
    Expression::cast<wasm::Load>(this);
    break;
  case StoreId:
    Expression::cast<wasm::Store>(this);
    break;
  case ConstId:
    Expression::cast<wasm::Const>(this);
    break;
  case UnaryId:
    Expression::cast<wasm::Unary>(this);
    break;
  case BinaryId:
    Expression::cast<wasm::Binary>(this);
    break;
  case SelectId:
    Expression::cast<wasm::Select>(this);
    break;
  case DropId:
    Expression::cast<wasm::Drop>(this);
    break;
  case ReturnId:
    Expression::cast<wasm::Return>(this);
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(this);
    break;
  case MemoryGrowId:
    Expression::cast<wasm::MemoryGrow>(this);
    break;
  case NopId:
    Expression::cast<wasm::Nop>(this);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(this);
    break;
  case AtomicRMWId:
    Expression::cast<wasm::AtomicRMW>(this);
    break;
  case AtomicCmpxchgId:
    Expression::cast<wasm::AtomicCmpxchg>(this);
    break;
  case AtomicWaitId:
    Expression::cast<wasm::AtomicWait>(this);
    break;
  case AtomicNotifyId:
    Expression::cast<wasm::AtomicNotify>(this);
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(this);
    break;
  case SIMDExtractId:
    Expression::cast<wasm::SIMDExtract>(this);
    break;
  case SIMDReplaceId:
    Expression::cast<wasm::SIMDReplace>(this);
    break;
  case SIMDShuffleId:
    Expression::cast<wasm::SIMDShuffle>(this);
    break;
  case SIMDTernaryId:
    Expression::cast<wasm::SIMDTernary>(this);
    break;
  case SIMDShiftId:
    Expression::cast<wasm::SIMDShift>(this);
    break;
  case SIMDLoadId:
    Expression::cast<wasm::SIMDLoad>(this);
    break;
  case SIMDLoadStoreLaneId:
    Expression::cast<wasm::SIMDLoadStoreLane>(this);
    break;
  case MemoryInitId:
    Expression::cast<wasm::MemoryInit>(this);
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(this);
    break;
  case MemoryCopyId:
    Expression::cast<wasm::MemoryCopy>(this);
    break;
  case MemoryFillId:
    Expression::cast<wasm::MemoryFill>(this);
    break;
  case PopId:
    Expression::cast<wasm::Pop>(this);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(this);
    break;
  case RefIsNullId:
    Expression::cast<wasm::RefIsNull>(this);
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(this);
    break;
  case RefEqId:
    Expression::cast<wasm::RefEq>(this);
    break;
  case TableGetId:
    Expression::cast<wasm::TableGet>(this);
    break;
  case TableSetId:
    Expression::cast<wasm::TableSet>(this);
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(this);
    break;
  case TableGrowId:
    Expression::cast<wasm::TableGrow>(this);
    break;
  case TryId:
    pTVar1 = Expression::cast<wasm::Try>(this);
LAB_009de23c:
    uniquify::Walker::doPreVisitControlFlow::anon_class_8_1_89917c4a::operator()
              ((anon_class_8_1_89917c4a *)&self_local,&pTVar1->name);
    break;
  case ThrowId:
    Expression::cast<wasm::Throw>(this);
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(this);
    break;
  case TupleMakeId:
    Expression::cast<wasm::TupleMake>(this);
    break;
  case TupleExtractId:
    Expression::cast<wasm::TupleExtract>(this);
    break;
  case I31NewId:
    Expression::cast<wasm::I31New>(this);
    break;
  case I31GetId:
    Expression::cast<wasm::I31Get>(this);
    break;
  case CallRefId:
    Expression::cast<wasm::CallRef>(this);
    break;
  case RefTestId:
    Expression::cast<wasm::RefTest>(this);
    break;
  case RefCastId:
    Expression::cast<wasm::RefCast>(this);
    break;
  case BrOnId:
    Expression::cast<wasm::BrOn>(this);
    break;
  case StructNewId:
    Expression::cast<wasm::StructNew>(this);
    break;
  case StructGetId:
    Expression::cast<wasm::StructGet>(this);
    break;
  case StructSetId:
    Expression::cast<wasm::StructSet>(this);
    break;
  case ArrayNewId:
    Expression::cast<wasm::ArrayNew>(this);
    break;
  case ArrayNewSegId:
    Expression::cast<wasm::ArrayNewSeg>(this);
    break;
  case ArrayNewFixedId:
    Expression::cast<wasm::ArrayNewFixed>(this);
    break;
  case ArrayGetId:
    Expression::cast<wasm::ArrayGet>(this);
    break;
  case ArraySetId:
    Expression::cast<wasm::ArraySet>(this);
    break;
  case ArrayLenId:
    Expression::cast<wasm::ArrayLen>(this);
    break;
  case ArrayCopyId:
    Expression::cast<wasm::ArrayCopy>(this);
    break;
  case ArrayFillId:
    Expression::cast<wasm::ArrayFill>(this);
    break;
  case ArrayInitId:
    Expression::cast<wasm::ArrayInit>(this);
    break;
  case RefAsId:
    Expression::cast<wasm::RefAs>(this);
    break;
  case StringNewId:
    Expression::cast<wasm::StringNew>(this);
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(this);
    break;
  case StringMeasureId:
    Expression::cast<wasm::StringMeasure>(this);
    break;
  case StringEncodeId:
    Expression::cast<wasm::StringEncode>(this);
    break;
  case StringConcatId:
    Expression::cast<wasm::StringConcat>(this);
    break;
  case StringEqId:
    Expression::cast<wasm::StringEq>(this);
    break;
  case StringAsId:
    Expression::cast<wasm::StringAs>(this);
    break;
  case StringWTF8AdvanceId:
    Expression::cast<wasm::StringWTF8Advance>(this);
    break;
  case StringWTF16GetId:
    Expression::cast<wasm::StringWTF16Get>(this);
    break;
  case StringIterNextId:
    Expression::cast<wasm::StringIterNext>(this);
    break;
  case StringIterMoveId:
    Expression::cast<wasm::StringIterMove>(this);
    break;
  case StringSliceWTFId:
    Expression::cast<wasm::StringSliceWTF>(this);
    break;
  case StringSliceIterId:
    Expression::cast<wasm::StringSliceIter>(this);
  }
  return;
}

Assistant:

static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }